

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.c
# Opt level: O1

void * unix_mmap(void *addr,size_t size,size_t try_alignment,int protect_flags,_Bool large_only,
                _Bool allow_large,_Bool *is_large)

{
  _Bool _Var1;
  _Bool _Var2;
  void *pvVar3;
  uint *puVar4;
  long lVar5;
  void *__addr;
  undefined3 in_register_00000089;
  int fd;
  uint flags;
  bool bVar6;
  
  fd = CONCAT31(in_register_00000089,allow_large);
  _Var1 = _mi_os_has_overcommit();
  if (CONCAT31(in_register_00000089,allow_large) == 0) {
LAB_00476b98:
    __addr = (void *)0x0;
  }
  else {
    if (!large_only) {
      _Var2 = _mi_os_use_large_page(size,try_alignment);
      if (!_Var2) {
        __addr = (void *)0x0;
        goto LAB_00476bf0;
      }
      lVar5 = mi_option_get(mi_option_allow_large_os_pages);
      if (lVar5 != 1) goto LAB_00476b98;
    }
    if (unix_mmap::large_page_try_ok == 0 || large_only) {
      bVar6 = !large_only;
      if (((size & 0x3fffffff) != 0 || bVar6) ||
         (flags = 0x78040022, unix_mmap_mi_huge_pages_available == '\x01')) {
        flags = 0x54040022;
      }
      *is_large = true;
      pvVar3 = unix_mmap_prim_aligned(addr,size,try_alignment,protect_flags,flags,fd);
      if (pvVar3 == (void *)0x0) {
        if ((~flags & 0x78000000) == 0) {
          unix_mmap_mi_huge_pages_available = '\x01';
          if (large_only) {
            puVar4 = (uint *)__errno_location();
            _mi_warning_message("unable to allocate huge (1GiB) page, trying large (2MiB) pages instead (errno: %i)\n"
                                ,(ulong)*puVar4);
          }
          pvVar3 = unix_mmap_prim_aligned(addr,size,try_alignment,protect_flags,0x54040022,fd);
        }
        else {
          pvVar3 = (void *)0x0;
        }
      }
      __addr = pvVar3;
      if (!large_only && pvVar3 == (void *)0x0) {
        unix_mmap::large_page_try_ok = 8;
        __addr = (void *)0x0;
      }
    }
    else {
      unix_mmap::large_page_try_ok = unix_mmap::large_page_try_ok - 1;
      LOCK();
      UNLOCK();
      bVar6 = true;
      __addr = (void *)0x0;
      pvVar3 = addr;
    }
    if (!bVar6) {
      return pvVar3;
    }
  }
LAB_00476bf0:
  if (__addr == (void *)0x0) {
    *is_large = false;
    __addr = unix_mmap_prim_aligned
                       (addr,size,try_alignment,protect_flags,(uint)_Var1 << 0xe | 0x22,fd);
    if ((allow_large && __addr != (void *)0x0) &&
       (_Var1 = _mi_os_use_large_page(size,try_alignment), _Var1)) {
      madvise(__addr,size,0xe);
    }
  }
  return __addr;
}

Assistant:

static void* unix_mmap(void* addr, size_t size, size_t try_alignment, int protect_flags, bool large_only, bool allow_large, bool* is_large) {
  #if !defined(MAP_ANONYMOUS)
  #define MAP_ANONYMOUS  MAP_ANON
  #endif
  #if !defined(MAP_NORESERVE)
  #define MAP_NORESERVE  0
  #endif
  void* p = NULL;
  const int fd = unix_mmap_fd();
  int flags = MAP_PRIVATE | MAP_ANONYMOUS;
  if (_mi_os_has_overcommit()) {
    flags |= MAP_NORESERVE;
  }
  #if defined(PROT_MAX)
  protect_flags |= PROT_MAX(PROT_READ | PROT_WRITE); // BSD
  #endif
  // huge page allocation
  if (allow_large && (large_only || (_mi_os_use_large_page(size, try_alignment) && mi_option_get(mi_option_allow_large_os_pages) == 1))) {
    static _Atomic(size_t) large_page_try_ok; // = 0;
    size_t try_ok = mi_atomic_load_acquire(&large_page_try_ok);
    if (!large_only && try_ok > 0) {
      // If the OS is not configured for large OS pages, or the user does not have
      // enough permission, the `mmap` will always fail (but it might also fail for other reasons).
      // Therefore, once a large page allocation failed, we don't try again for `large_page_try_ok` times
      // to avoid too many failing calls to mmap.
      mi_atomic_cas_strong_acq_rel(&large_page_try_ok, &try_ok, try_ok - 1);
    }
    else {
      int lflags = flags & ~MAP_NORESERVE;  // using NORESERVE on huge pages seems to fail on Linux
      int lfd = fd;
      #ifdef MAP_ALIGNED_SUPER
      lflags |= MAP_ALIGNED_SUPER;
      #endif
      #ifdef MAP_HUGETLB
      lflags |= MAP_HUGETLB;
      #endif
      #ifdef MAP_HUGE_1GB
      static bool mi_huge_pages_available = true;
      if (large_only && (size % MI_GiB) == 0 && mi_huge_pages_available) {
        lflags |= MAP_HUGE_1GB;
      }
      else
      #endif
      {
        #ifdef MAP_HUGE_2MB
        lflags |= MAP_HUGE_2MB;
        #endif
      }
      #ifdef VM_FLAGS_SUPERPAGE_SIZE_2MB
      lfd |= VM_FLAGS_SUPERPAGE_SIZE_2MB;
      #endif
      if (large_only || lflags != flags) {
        // try large OS page allocation
        *is_large = true;
        p = unix_mmap_prim_aligned(addr, size, try_alignment, protect_flags, lflags, lfd);
        #ifdef MAP_HUGE_1GB
        if (p == NULL && (lflags & MAP_HUGE_1GB) == MAP_HUGE_1GB) {
          mi_huge_pages_available = false; // don't try huge 1GiB pages again
          if (large_only) {
            _mi_warning_message("unable to allocate huge (1GiB) page, trying large (2MiB) pages instead (errno: %i)\n", errno);
          }
          lflags = ((lflags & ~MAP_HUGE_1GB) | MAP_HUGE_2MB);
          p = unix_mmap_prim_aligned(addr, size, try_alignment, protect_flags, lflags, lfd);
        }
        #endif
        if (large_only) return p;
        if (p == NULL) {
          mi_atomic_store_release(&large_page_try_ok, (size_t)8);  // on error, don't try again for the next N allocations
        }
      }
    }
  }
  // regular allocation
  if (p == NULL) {
    *is_large = false;
    p = unix_mmap_prim_aligned(addr, size, try_alignment, protect_flags, flags, fd);
    if (p != NULL) {
      #if defined(MADV_HUGEPAGE)
      // Many Linux systems don't allow MAP_HUGETLB but they support instead
      // transparent huge pages (THP). Generally, it is not required to call `madvise` with MADV_HUGE
      // though since properly aligned allocations will already use large pages if available
      // in that case -- in particular for our large regions (in `memory.c`).
      // However, some systems only allow THP if called with explicit `madvise`, so
      // when large OS pages are enabled for mimalloc, we call `madvise` anyways.
      if (allow_large && _mi_os_use_large_page(size, try_alignment)) {
        if (unix_madvise(p, size, MADV_HUGEPAGE) == 0) {
          // *is_large = true; // possibly
        };
      }
      #elif defined(__sun)
      if (allow_large && _mi_os_use_large_page(size, try_alignment)) {
        struct memcntl_mha cmd = {0};
        cmd.mha_pagesize = _mi_os_large_page_size();
        cmd.mha_cmd = MHA_MAPSIZE_VA;
        if (memcntl((caddr_t)p, size, MC_HAT_ADVISE, (caddr_t)&cmd, 0, 0) == 0) {
          // *is_large = true; // possibly
        }
      }
      #endif
    }
  }
  return p;
}